

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::StringParameter::SerializeWithCachedSizes
          (StringParameter *this,CodedOutputStream *output)

{
  string *psVar1;
  size_type sVar2;
  
  psVar1 = (this->defaultvalue_).ptr_;
  sVar2 = psVar1->_M_string_length;
  if (sVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar1->_M_dataplus)._M_p,(int)sVar2,SERIALIZE,
               "CoreML.Specification.StringParameter.defaultValue");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (1,(this->defaultvalue_).ptr_,output);
    return;
  }
  return;
}

Assistant:

void StringParameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.StringParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // string defaultValue = 1;
  if (this->defaultvalue().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->defaultvalue().data(), this->defaultvalue().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.StringParameter.defaultValue");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->defaultvalue(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.StringParameter)
}